

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O1

uint __thiscall
pktalloc::CustomBitSet<2048U>::FindFirstClear(CustomBitSet<2048U> *this,uint bitStart)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar3 = bitStart >> 6;
  uVar4 = (ulong)uVar3;
  uVar6 = ~*(ulong *)(this + uVar4 * 8) >> ((ulong)bitStart & 0x3f);
  if (uVar6 != 0) {
    iVar7 = 0;
    for (uVar4 = uVar6; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
      iVar7 = iVar7 + 1;
    }
    if ((uVar6 & 1) != 0) {
      iVar7 = 0;
    }
    return iVar7 + bitStart;
  }
  uVar5 = 0x1f;
  if (0x1f < uVar3) {
    uVar5 = uVar3;
  }
  iVar7 = -(bitStart & 0xffffffc0);
  do {
    if (uVar5 == uVar4) {
      return 0x800;
    }
    lVar1 = uVar4 * 8;
    uVar4 = uVar4 + 1;
    iVar7 = iVar7 + -0x40;
  } while (*(ulong *)(this + lVar1 + 8) == 0xffffffffffffffff);
  iVar2 = 0;
  for (uVar4 = ~*(ulong *)(this + lVar1 + 8); (uVar4 & 1) == 0;
      uVar4 = uVar4 >> 1 | 0x8000000000000000) {
    iVar2 = iVar2 + 1;
  }
  return iVar2 - iVar7;
}

Assistant:

unsigned FindFirstClear(const unsigned bitStart)
    {
        static_assert(kWordBits == 64, "Update this");

        const unsigned wordStart = bitStart / kWordBits;

        WordT word = ~Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        for (unsigned i = wordStart + 1; i < kWords; ++i)
        {
            word = ~Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return kValidBits;
    }